

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O1

int writeString(FILE *stream,writeoutvar *wovar,per_transfer *per,CURLcode per_result,_Bool use_json
               )

{
  CURLINFO CVar1;
  writeoutid wVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *strinfo;
  long version;
  char *local_30;
  ulong local_28;
  
  local_30 = (char *)0x0;
  CVar1 = wovar->ci;
  if (CVar1 == CURLINFO_NONE) {
    wVar2 = wovar->id;
    if (wVar2 == VAR_EFFECTIVE_FILENAME) {
      pcVar5 = (per->outs).filename;
    }
    else {
      if (wVar2 != VAR_INPUT_URL) {
        if ((wVar2 == VAR_ERRORMSG) && (per_result != CURLE_OK)) {
          if (per->errorbuffer[0] == '\0') {
            pcVar5 = (char *)curl_easy_strerror(per_result);
          }
          else {
            pcVar5 = per->errorbuffer;
          }
          goto LAB_0011cd2c;
        }
        goto LAB_0011cce9;
      }
      pcVar5 = per->this_url;
    }
    if (pcVar5 != (char *)0x0) goto LAB_0011cd2c;
  }
  else {
    if (CVar1 == CURLINFO_HTTP_VERSION) {
      local_28 = 0;
      iVar4 = curl_easy_getinfo(per->curl,0x20002e,&local_28);
      bVar3 = local_28 < 5 && iVar4 == 0;
      if (local_28 < 5 && iVar4 == 0) {
        local_30 = http_version_rel + *(int *)(http_version_rel + local_28 * 4);
      }
    }
    else {
      iVar4 = curl_easy_getinfo(per->curl,CVar1,&local_30);
      bVar3 = local_30 != (char *)0x0 && iVar4 == 0;
    }
    pcVar5 = local_30;
    if (bVar3) {
LAB_0011cd2c:
      local_30 = pcVar5;
      pcVar5 = local_30;
      if (use_json) {
        curl_mfprintf(stream,"\"%s\":\"",wovar->name);
        jsonWriteString(stream,local_30);
        pcVar5 = "\"";
      }
      fputs(pcVar5,(FILE *)stream);
      return 1;
    }
  }
LAB_0011cce9:
  if (use_json) {
    curl_mfprintf(stream,"\"%s\":null",wovar->name);
  }
  return 1;
}

Assistant:

static int writeString(FILE *stream, const struct writeoutvar *wovar,
                       struct per_transfer *per, CURLcode per_result,
                       bool use_json)
{
  bool valid = false;
  const char *strinfo = NULL;

  DEBUGASSERT(wovar->writefunc == writeString);

  if(wovar->ci) {
    if(wovar->ci == CURLINFO_HTTP_VERSION) {
      long version = 0;
      if(!curl_easy_getinfo(per->curl, CURLINFO_HTTP_VERSION, &version) &&
         (version >= 0) &&
         (version < (long)(sizeof(http_version)/sizeof(http_version[0])))) {
        strinfo = http_version[version];
        valid = true;
      }
    }
    else {
      if(!curl_easy_getinfo(per->curl, wovar->ci, &strinfo) && strinfo)
        valid = true;
    }
  }
  else {
    switch(wovar->id) {
    case VAR_ERRORMSG:
      if(per_result) {
        strinfo = per->errorbuffer[0] ? per->errorbuffer :
                  curl_easy_strerror(per_result);
        valid = true;
      }
      break;
    case VAR_EFFECTIVE_FILENAME:
      if(per->outs.filename) {
        strinfo = per->outs.filename;
        valid = true;
      }
      break;
    case VAR_INPUT_URL:
      if(per->this_url) {
        strinfo = per->this_url;
        valid = true;
      }
      break;
    default:
      DEBUGASSERT(0);
      break;
    }
  }

  if(valid) {
    DEBUGASSERT(strinfo);
    if(use_json) {
      fprintf(stream, "\"%s\":\"", wovar->name);
      jsonWriteString(stream, strinfo);
      fputs("\"", stream);
    }
    else
      fputs(strinfo, stream);
  }
  else {
    if(use_json)
      fprintf(stream, "\"%s\":null", wovar->name);
  }

  return 1; /* return 1 if anything was written */
}